

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O3

vector<arc::atom,_std::allocator<arc::atom>_> *
arc::atom_to_vector(vector<arc::atom,_std::allocator<arc::atom>_> *__return_storage_ptr__,atom *a)

{
  variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
  *__v;
  element_type *peVar1;
  variant_alternative_t<1UL,_variant<monostate,_shared_ptr<cons>,_basic_string<char>_*,_double,_error_(*)(const_vector<atom,_allocator<atom>_>_&,_atom_*),_shared_ptr<closure>,_shared_ptr<basic_string<char>_>,__IO_FILE_*,_shared_ptr<unordered_map<atom,_atom,_hash<arc::atom>,_equal_to<atom>,_allocator<pair<const_atom,_atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_>
  *pvVar2;
  anon_class_8_1_8991fb9c_conflict local_30;
  
  (__return_storage_ptr__->super__Vector_base<arc::atom,_std::allocator<arc::atom>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<arc::atom,_std::allocator<arc::atom>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<arc::atom,_std::allocator<arc::atom>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (a->type != T_NIL) {
    __v = &a->val;
    do {
      pvVar2 = std::
               get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                         (__v);
      std::vector<arc::atom,_std::allocator<arc::atom>_>::push_back
                (__return_storage_ptr__,
                 &((pvVar2->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->car)
      ;
      pvVar2 = std::
               get<1ul,std::monostate,std::shared_ptr<arc::cons>,std::__cxx11::string*,double,arc::error(*)(std::vector<arc::atom,std::allocator<arc::atom>>const&,arc::atom*),std::shared_ptr<arc::closure>,std::shared_ptr<std::__cxx11::string>,_IO_FILE*,std::shared_ptr<std::unordered_map<arc::atom,arc::atom,std::hash<arc::atom>,std::equal_to<arc::atom>,std::allocator<std::pair<arc::atom_const,arc::atom>>>>,char,__jmp_buf_tag(*)[1]>
                         (__v);
      peVar1 = (pvVar2->super___shared_ptr<arc::cons,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      a->type = (peVar1->cdr).type;
      local_30.this =
           (_Copy_assign_base<false,_std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
            *)__v;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>_&>
        ::_S_vtable._M_arr
        [*(__index_type *)
          ((long)&(peVar1->cdr).val.
                  super__Variant_base<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_double,_arc::error_(*)(const_std::vector<arc::atom,_std::allocator<arc::atom>_>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom,_std::hash<arc::atom>,_std::equal_to<arc::atom>,_std::allocator<std::pair<const_arc::atom,_arc::atom>_>_>_>,_char,___jmp_buf_tag_(*)[1]>
                  .
                  super__Move_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
                  .
                  super__Copy_assign_alias<std::monostate,_std::shared_ptr<arc::cons>,_std::__cxx11::basic_string<char>_*,_double,_arc::error_(*)(const_std::vector<arc::atom>_&,_arc::atom_*),_std::shared_ptr<arc::closure>,_std::shared_ptr<std::__cxx11::basic_string<char>_>,__IO_FILE_*,_std::shared_ptr<std::unordered_map<arc::atom,_arc::atom>_>,_char,___jmp_buf_tag_(*)[1]>
          + 0x10)]._M_data)(&local_30,&(peVar1->cdr).val);
    } while (a->type != T_NIL);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<atom> atom_to_vector(atom a) {
		vector<atom> r;
		for (; !no(a); a = cdr(a)) {
			r.push_back(car(a));
		}
		return r;
	}